

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlWriter::~XmlWriter(XmlWriter *this)

{
  bool bVar1;
  XmlWriter *this_local;
  
  while( true ) {
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&this->m_tags);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    endElement(this);
  }
  std::__cxx11::string::~string((string *)&this->m_indent);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->m_tags);
  return;
}

Assistant:

~XmlWriter() {
            while( !m_tags.empty() )
                endElement();
        }